

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_builder.cc
# Opt level: O1

void __thiscall
leveldb::TableBuilder::WriteRawBlock
          (TableBuilder *this,Slice *block_contents,CompressionType type,BlockHandle *handle)

{
  Rep *pRVar1;
  char *pcVar2;
  uint32_t uVar3;
  long in_FS_OFFSET;
  char trailer [5];
  Status local_48;
  undefined8 local_40;
  Status local_38;
  char local_2d;
  int local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pRVar1 = this->rep_;
  handle->offset_ = pRVar1->offset;
  handle->size_ = block_contents->size_;
  (*pRVar1->file->_vptr_WritableFile[2])(&local_48,pRVar1->file,block_contents);
  pcVar2 = (pRVar1->status).state_;
  (pRVar1->status).state_ = local_48.state_;
  local_48.state_ = pcVar2;
  if (pcVar2 != (char *)0x0) {
    operator_delete__(pcVar2);
  }
  if ((pRVar1->status).state_ == (char *)0x0) {
    local_2d = (char)type;
    uVar3 = crc32c::Extend(0,block_contents->data_,block_contents->size_);
    uVar3 = crc32c::Extend(uVar3,&local_2d,1);
    local_2c = (uVar3 << 0x11 | uVar3 >> 0xf) + 0xa282ead8;
    local_40 = 5;
    local_48.state_ = &local_2d;
    (*pRVar1->file->_vptr_WritableFile[2])(&local_38);
    pcVar2 = (pRVar1->status).state_;
    (pRVar1->status).state_ = local_38.state_;
    local_38.state_ = pcVar2;
    if (pcVar2 != (char *)0x0) {
      operator_delete__(pcVar2);
    }
    if ((pRVar1->status).state_ == (char *)0x0) {
      pRVar1->offset = block_contents->size_ + pRVar1->offset + 5;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TableBuilder::WriteRawBlock(const Slice& block_contents,
                                 CompressionType type, BlockHandle* handle) {
  Rep* r = rep_;
  handle->set_offset(r->offset);
  handle->set_size(block_contents.size());
  r->status = r->file->Append(block_contents);
  if (r->status.ok()) {
    char trailer[kBlockTrailerSize];
    trailer[0] = type;
    uint32_t crc = crc32c::Value(block_contents.data(), block_contents.size());
    crc = crc32c::Extend(crc, trailer, 1);  // Extend crc to cover block type
    EncodeFixed32(trailer + 1, crc32c::Mask(crc));
    r->status = r->file->Append(Slice(trailer, kBlockTrailerSize));
    if (r->status.ok()) {
      r->offset += block_contents.size() + kBlockTrailerSize;
    }
  }
}